

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT8 __thiscall DROPlayer::SetDeviceOptions(DROPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong uVar1;
  pointer pDVar2;
  void *pvVar3;
  DEVFUNC_OPTMASK p_Var4;
  UINT8 UVar5;
  size_t sVar6;
  
  sVar6 = DeviceID2OptionID(this,id);
  if (sVar6 == 0xffffffffffffffff) {
    UVar5 = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar6,devOpts,0xa0);
    uVar1 = this->_optDevMap[sVar6];
    pDVar2 = (this->_devices).
             super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)(((long)(this->_devices).
                               super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 3) *
                       -0x30c30c30c30c30c3)) {
      pvVar3 = pDVar2[uVar1].base.defInf.dataPtr;
      if ((pvVar3 != (void *)0x0) &&
         (p_Var4 = (pDVar2[uVar1].base.defInf.devDef)->SetMuteMask, p_Var4 != (DEVFUNC_OPTMASK)0x0))
      {
        (*p_Var4)(pvVar3,this->_devOpts[sVar6].muteOpts.chnMute[0]);
      }
    }
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

UINT8 DROPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	// no immediate changes necessary for OPL2/OPL3
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}